

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O2

int __thiscall tetgenmesh::segfacetadjacent(tetgenmesh *this,face *subseg,face *subsh)

{
  uint *puVar1;
  byte *pbVar2;
  point pdVar3;
  point pdVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar5 = *(int *)((long)subseg->sh + (long)this->shmarkindex * 4 + 8);
  pdVar3 = this->segmentendpointslist[(long)iVar5 * 2];
  pdVar4 = this->segmentendpointslist[iVar5 * 2 + 1];
  puVar1 = (uint *)((long)pdVar3 + (long)this->pointmarkindex * 4 + 4);
  *puVar1 = *puVar1 | 1;
  puVar1 = (uint *)((long)pdVar4 + (long)this->pointmarkindex * 4 + 4);
  *puVar1 = *puVar1 | 1;
  lVar6 = (long)*(int *)((long)subsh->sh + (long)this->shmarkindex * 4 + 8);
  iVar5 = 0;
  for (lVar7 = (long)this->idx2facetlist[lVar6]; lVar7 < this->idx2facetlist[lVar6 + 1];
      lVar7 = lVar7 + 1) {
    iVar5 = iVar5 + (*(uint *)((long)this->facetverticeslist[lVar7] +
                              (long)this->pointmarkindex * 4 + 4) & 1);
  }
  pbVar2 = (byte *)((long)pdVar3 + (long)this->pointmarkindex * 4 + 4);
  *pbVar2 = *pbVar2 & 0xfe;
  puVar1 = (uint *)((long)pdVar4 + (long)this->pointmarkindex * 4 + 4);
  *puVar1 = *puVar1 & 0xfffffffe;
  return (int)(iVar5 == 1);
}

Assistant:

inline int tetgenmesh::getfacetindex(face& s)
{
  return ((int *) (s.sh))[shmarkindex + 2];
}